

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O1

CharFormat testing::internal::PrintCharsAsStringTo<char>(char *begin,size_t len,ostream *os)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  CharFormat CVar4;
  CharFormat CVar5;
  size_t sVar6;
  long in_FS_OFFSET;
  bool bVar7;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
  if (len == 0) {
    CVar5 = kAsIs;
  }
  else {
    bVar7 = false;
    sVar6 = 0;
    CVar5 = kAsIs;
    do {
      bVar1 = begin[sVar6];
      if ((bVar7) && (iVar3 = isxdigit((uint)bVar1), iVar3 != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"\" ",2);
        std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
      }
      CVar4 = PrintAsStringLiteralTo((uint)bVar1,os);
      bVar7 = CVar4 == kHexEscape;
      if (bVar7) {
        CVar5 = kHexEscape;
      }
      sVar6 = sVar6 + 1;
    } while (len != sVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
  return CVar5;
}

Assistant:

static CharFormat PrintCharsAsStringTo(
    const CharType* begin, size_t len, ostream* os) {
  const char* const kQuoteBegin = sizeof(CharType) == 1 ? "\"" : "L\"";
  *os << kQuoteBegin;
  bool is_previous_hex = false;
  CharFormat print_format = kAsIs;
  for (size_t index = 0; index < len; ++index) {
    const CharType cur = begin[index];
    if (is_previous_hex && IsXDigit(cur)) {
      // Previous character is of '\x..' form and this character can be
      // interpreted as another hexadecimal digit in its number. Break string to
      // disambiguate.
      *os << "\" " << kQuoteBegin;
    }
    is_previous_hex = PrintAsStringLiteralTo(cur, os) == kHexEscape;
    // Remember if any characters required hex escaping.
    if (is_previous_hex) {
      print_format = kHexEscape;
    }
  }
  *os << "\"";
  return print_format;
}